

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableIntTest_NopointerSerialization_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_NopointerSerialization_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  int i;
  char *pcVar6;
  char *in_R9;
  bool bVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  TypeParam ht_in;
  TypeParam ht_out;
  key_equal local_180;
  undefined1 local_170 [8];
  undefined8 *local_168;
  AssertHelper local_160;
  string local_158;
  undefined1 local_138 [8];
  undefined1 local_130 [112];
  pointer local_c0;
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_b0;
  
  local_158._M_dataplus._M_p = (pointer)0x0;
  local_158._M_string_length = local_158._M_string_length & 0xffffffff00000000;
  local_170 = (undefined1  [8])0x0;
  local_168 = (undefined8 *)((ulong)local_168 & 0xffffffff00000000);
  local_138 = (undefined1  [8])((ulong)local_138 & 0xffffffff00000000);
  local_130._0_8_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (&local_b0,0,(hasher *)&local_158,(key_equal *)local_170,(allocator_type *)local_138);
  iVar4 = UniqueObjectHelper<int>(2000);
  this_00 = &local_b0.
             super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(this_00);
  local_b0.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = -iVar4;
  local_b0.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_ = true;
  iVar4 = 1;
  do {
    iVar5 = UniqueObjectHelper<int>(iVar4);
    local_158._M_dataplus._M_p._0_4_ = iVar5;
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)local_138,
             &local_b0.
              super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ,(value_type *)&local_158);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 100);
  iVar4 = UniqueObjectHelper<int>(0x38);
  local_138._0_4_ = -iVar4;
  google::
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(this_00,(key_type *)local_138);
  iVar4 = UniqueObjectHelper<int>(0x16);
  local_138._0_4_ = -iVar4;
  google::
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(this_00,(key_type *)local_138);
  __stream = tmpfile();
  bVar7 = __stream != (FILE *)0x0;
  local_158._M_dataplus._M_p._0_1_ = bVar7;
  local_158._M_string_length = 0;
  if (!bVar7) {
    testing::Message::Message((Message *)local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_138,(internal *)&local_158,(AssertionResult *)"fp != __null","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4d6,(char *)local_138);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
    if (local_138 != (undefined1  [8])(local_130 + 8)) {
      operator_delete((void *)local_138);
    }
    if (local_170 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_170 + 8))();
    }
  }
  sVar2 = local_158._M_string_length;
  if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_158._M_string_length !=
        (undefined8 *)(local_158._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_158._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  bVar3 = google::
          dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::serialize<google::sparsehash_internal::pod_serializer<int>,_IO_FILE>
                    ((dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00);
  local_158._M_dataplus._M_p._0_1_ = bVar3;
  local_158._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_138,(internal *)&local_158,
               (AssertionResult *)"ht_out.serialize(typename TypeParam::NopointerSerializer(), fp)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4d7,(char *)local_138);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
    if (local_138 != (undefined1  [8])(local_130 + 8)) {
      operator_delete((void *)local_138);
    }
    if (local_170 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_170 + 8))();
    }
  }
  sVar2 = local_158._M_string_length;
  if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_158._M_string_length !=
        (undefined8 *)(local_158._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_158._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  rewind(__stream);
  local_170 = (undefined1  [8])0x0;
  local_168 = (undefined8 *)((ulong)local_168 & 0xffffffff00000000);
  local_180._0_8_ = (long *)0x0;
  local_180.num_compares_ = 0;
  local_158._M_dataplus._M_p = local_158._M_dataplus._M_p & 0xffffffff00000000;
  local_158._M_string_length = 0;
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_138,0,(hasher *)local_170,&local_180,(allocator_type *)&local_158);
  local_170[0] = (internal)bVar7;
  local_168 = (undefined8 *)0x0;
  if (__stream == (FILE *)0x0) {
    testing::Message::Message((Message *)&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)local_170,(AssertionResult *)"fp != __null","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4db,local_158._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((long *)local_180._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_180._0_8_ + 8))();
    }
  }
  puVar1 = local_168;
  if (local_168 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_168 != local_168 + 2) {
      operator_delete((undefined8 *)*local_168);
    }
    operator_delete(puVar1);
  }
  bVar7 = google::
          dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::unserialize<google::sparsehash_internal::pod_serializer<int>,_IO_FILE>
                    ((dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)local_130,__stream);
  local_170[0] = (internal)bVar7;
  local_168 = (undefined8 *)0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)local_170,
               (AssertionResult *)"ht_in.unserialize(typename TypeParam::NopointerSerializer(), fp)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4dc,local_158._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((long *)local_180._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_180._0_8_ + 8))();
    }
  }
  puVar1 = local_168;
  if (local_168 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_168 != local_168 + 2) {
      operator_delete((undefined8 *)*local_168);
    }
    operator_delete(puVar1);
  }
  fclose(__stream);
  iVar4 = UniqueObjectHelper<int>(1);
  local_180.id_ = iVar4;
  local_160.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_160.data_._0_4_ = -(int)local_160.data_;
  google::
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)&local_158,
              (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_130,(int *)&local_160);
  local_158.field_2._8_8_ =
       (HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_138;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_170,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             &local_180.id_,(int *)local_158._M_string_length);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_168 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4df,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
    if ((long *)local_158._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_158._M_dataplus._M_p + 8))();
    }
  }
  puVar1 = local_168;
  if (local_168 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_168 != local_168 + 2) {
      operator_delete((undefined8 *)*local_168);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(99);
  local_180.id_ = iVar4;
  local_160.data_._0_4_ = UniqueObjectHelper<int>(99);
  local_160.data_._0_4_ = -(int)local_160.data_;
  google::
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)&local_158,
              (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_130,(int *)&local_160);
  local_158.field_2._8_8_ =
       (HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_138;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_170,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             &local_180.id_,(int *)local_158._M_string_length);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_168 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4e0,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
    if ((long *)local_158._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_158._M_dataplus._M_p + 8))();
    }
  }
  puVar1 = local_168;
  if (local_168 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_168 != local_168 + 2) {
      operator_delete((undefined8 *)*local_168);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(100);
  local_158._M_dataplus._M_p._0_4_ = -iVar4;
  pVar8 = google::
          dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>
                    ((dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_130,(int *)&local_158);
  bVar7 = pVar8.first == 0xffffffffffffffff;
  local_170[0] = (internal)bVar7;
  local_168 = (undefined8 *)0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)local_170,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4e1,local_158._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((long *)local_180._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_180._0_8_ + 8))();
    }
  }
  puVar1 = local_168;
  if (local_168 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_168 != local_168 + 2) {
      operator_delete((undefined8 *)*local_168);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(0x15);
  local_180.id_ = iVar4;
  local_160.data_._0_4_ = UniqueObjectHelper<int>(0x15);
  local_160.data_._0_4_ = -(int)local_160.data_;
  google::
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)&local_158,
              (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_130,(int *)&local_160);
  local_158.field_2._8_8_ =
       (HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_138;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_170,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             &local_180.id_,(int *)local_158._M_string_length);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_168 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4e2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
    if ((long *)local_158._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_158._M_dataplus._M_p + 8))();
    }
  }
  puVar1 = local_168;
  if (local_168 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_168 != local_168 + 2) {
      operator_delete((undefined8 *)*local_168);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(0x16);
  local_158._M_dataplus._M_p._0_4_ = -iVar4;
  pVar8 = google::
          dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>
                    ((dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_130,(int *)&local_158);
  bVar7 = pVar8.first == 0xffffffffffffffff;
  local_170[0] = (internal)bVar7;
  local_168 = (undefined8 *)0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)local_170,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4e4,local_158._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((long *)local_180._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_180._0_8_ + 8))();
    }
  }
  puVar1 = local_168;
  if (local_168 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_168 != local_168 + 2) {
      operator_delete((undefined8 *)*local_168);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(0x38);
  local_158._M_dataplus._M_p._0_4_ = -iVar4;
  pVar8 = google::
          dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>
                    ((dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_130,(int *)&local_158);
  bVar7 = pVar8.first == 0xffffffffffffffff;
  local_170[0] = (internal)bVar7;
  local_168 = (undefined8 *)0x0;
  if (!bVar7) {
    testing::Message::Message((Message *)&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)local_170,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4e5,local_158._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((long *)local_180._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_180._0_8_ + 8))();
    }
  }
  puVar1 = local_168;
  if (local_168 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_168 != local_168 + 2) {
      operator_delete((undefined8 *)*local_168);
    }
    operator_delete(puVar1);
  }
  local_138 = (undefined1  [8])&PTR__BaseHashtableInterface_00c23848;
  if (local_c0 != (pointer)0x0) {
    free(local_c0);
  }
  local_b0.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c23848;
  if (local_b0.
      super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.table != (pointer)0x0) {
    free(local_b0.
         super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, NopointerSerialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}